

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

void __thiscall
soul::SimpleTokeniser::SimpleTokeniser
          (SimpleTokeniser *this,CodeLocation *start,bool ignoreComments)

{
  bool ignoreComments_local;
  CodeLocation *start_local;
  SimpleTokeniser *this_local;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::Tokeniser(&this->super_SOULTokeniser);
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)&PTR__SimpleTokeniser_00641980;
  (this->super_SOULTokeniser).shouldIgnoreComments = ignoreComments;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::initialise(&this->super_SOULTokeniser,start);
  return;
}

Assistant:

SimpleTokeniser (const CodeLocation& start, bool ignoreComments)
    {
        shouldIgnoreComments = ignoreComments;
        initialise (start);
    }